

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  TestRunStats *_testRunStats_local;
  ConsoleReporter *this_local;
  
  printTotalsDivider(this,&_testRunStats->totals);
  printTotals(this,&_testRunStats->totals);
  std::ostream::operator<<
            ((this->super_StreamingReporterBase).stream,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            printTotalsDivider( _testRunStats.totals );
            printTotals( _testRunStats.totals );
            stream << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }